

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O0

void do_bleed(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *ch_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  CHAR_DATA *ch_01;
  CHAR_DATA *in_RDI;
  AFFECT_DATA af;
  OBJ_DATA *weapon;
  CHAR_DATA *victim;
  int affect;
  int dammod;
  int skill;
  char miss3 [4608];
  char miss2 [4608];
  char miss1 [4608];
  char hit3 [4608];
  char hit2 [4608];
  char hit1 [4608];
  undefined4 in_stack_ffffffffffff9348;
  undefined4 in_stack_ffffffffffff934c;
  void *in_stack_ffffffffffff9350;
  CHAR_DATA *in_stack_ffffffffffff9358;
  CHAR_DATA *in_stack_ffffffffffff9360;
  undefined8 in_stack_ffffffffffff9368;
  int in_stack_ffffffffffff9370;
  int in_stack_ffffffffffff9374;
  undefined2 in_stack_ffffffffffff9378;
  undefined2 in_stack_ffffffffffff937a;
  undefined2 in_stack_ffffffffffff937c;
  undefined2 in_stack_ffffffffffff937e;
  undefined2 in_stack_ffffffffffff9380;
  undefined2 in_stack_ffffffffffff9382;
  undefined2 in_stack_ffffffffffff9384;
  undefined2 in_stack_ffffffffffff9386;
  char local_6c18 [60];
  int in_stack_ffffffffffff9424;
  undefined1 in_stack_ffffffffffff942b;
  int in_stack_ffffffffffff942c;
  CHAR_DATA *in_stack_ffffffffffff9430;
  int in_stack_ffffffffffff944c;
  CHAR_DATA *in_stack_ffffffffffff9450;
  int in_stack_ffffffffffff945c;
  undefined1 in_stack_ffffffffffff9462;
  undefined1 in_stack_ffffffffffff9463;
  int in_stack_ffffffffffff9464;
  CHAR_DATA *in_stack_ffffffffffff9468;
  CHAR_DATA *in_stack_ffffffffffff9470;
  int in_stack_ffffffffffff9490;
  char *in_stack_ffffffffffff9498;
  char local_5a18 [4608];
  char local_4818 [4608];
  char local_3618 [4608];
  char local_2418 [4608];
  char local_1218 [4624];
  CHAR_DATA *local_8;
  
  local_8 = in_RDI;
  iVar2 = get_skill(in_stack_ffffffffffff9450,in_stack_ffffffffffff944c);
  if (iVar2 == 0) {
    send_to_char((char *)in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
  }
  else {
    ch_00 = local_8->fighting;
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
    }
    else {
      pOVar4 = get_eq_char(local_8,0x10);
      if (pOVar4 == (OBJ_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
      }
      else {
        ch_01 = (CHAR_DATA *)(ulong)(pOVar4->value[0] - 1);
        switch(ch_01) {
        case (CHAR_DATA *)0x0:
          sprintf(local_1218,"Rivulets of blood run to the ground as your blade finds $N\'s artery!"
                 );
          sprintf(local_2418,"Rivulets of blood run to the ground as $n\'s blade finds your artery!"
                 );
          sprintf(local_3618,
                  "Rivulets of blood run to the ground as $n\'s blade finds $N\'s artery!");
          sprintf(local_4818,"You slash at $N\'s exposed artery but fail to connect.");
          sprintf(local_5a18,"$n slashes at your exposed artery but fails to connect.");
          sprintf(local_6c18,"$n slashes at $N\'s exposed artery but fails to connect.");
          break;
        case (CHAR_DATA *)0x1:
          sprintf(local_1218,
                  "Blood fountains from $N\'s artery as you make a jagged cut with your dagger!");
          sprintf(local_2418,
                  "Blood fountains from your artery as $n makes a jagged cut with $s dagger!");
          sprintf(local_3618,
                  "Blood fountains from $N\'s artery as $n makes a jagged cut with $s dagger!");
          sprintf(local_4818,
                  "You lunge forward, attempting to strike $N\'s artery, but are repulsed.");
          sprintf(local_5a18,"$n lunges forward, attempting to strike your artery, but is repulsed."
                 );
          sprintf(local_6c18,
                  "$n lunges forward, attempting to strike $N\'s artery, but is repulsed.");
          break;
        case (CHAR_DATA *)0x2:
          sprintf(local_1218,
                  "You drive your spear deep into $N\'s flesh, blood spilling forth as you withdraw it!"
                 );
          sprintf(local_2418,
                  "$n drives $s spear deep into your flesh, blood spilling forth as $e withdraws it!"
                 );
          sprintf(local_3618,
                  "$n drives $s spear deep into $N\'s flesh, blood spilling forth as $e withdraws it!"
                 );
          sprintf(local_4818,"You lunge powerfully forward with your spear, but fail to connect.");
          sprintf(local_5a18,
                  "$n lunges powerfully forward towards you with $s spear, but fails to connect.");
          sprintf(local_6c18,
                  "$n lunges powerfully forward towards $N with $s spear, but fails to connect.");
          break;
        default:
          send_to_char((char *)in_stack_ffffffffffff9360,ch_01);
          return;
        case (CHAR_DATA *)0x4:
          sprintf(local_1218,
                  "You slightly twist your axe as it sinks into $N\'s flesh, and a torrent of blood gushes forth!"
                 );
          sprintf(local_2418,
                  "$n slightly twists $s axe as it sinks into your flesh, and a torrent of blood gushes forth!"
                 );
          sprintf(local_3618,
                  "$n slightly twists $s axe as it sinks into $N\'s flesh, and a torrent of blood gushes forth!"
                 );
          sprintf(local_4818,"You swing your axe in a wide arc but fail to connect with $N.");
          sprintf(local_5a18,"$n swings $s axe in a wide arc but fails to connect with you.");
          sprintf(local_6c18,"$n swings $s axe in a wide arc but fails to connect with $N.");
        }
        iVar3 = number_percent();
        if ((double)iVar2 * 0.65 <= (double)iVar3) {
          act((char *)in_stack_ffffffffffff9360,ch_01,in_stack_ffffffffffff9350,
              (void *)CONCAT44(in_stack_ffffffffffff934c,in_stack_ffffffffffff9348),0);
          act((char *)in_stack_ffffffffffff9360,ch_01,in_stack_ffffffffffff9350,
              (void *)CONCAT44(in_stack_ffffffffffff934c,in_stack_ffffffffffff9348),0);
          act((char *)in_stack_ffffffffffff9360,ch_01,in_stack_ffffffffffff9350,
              (void *)CONCAT44(in_stack_ffffffffffff934c,in_stack_ffffffffffff9348),0);
          iVar2 = (int)((ulong)ch_01 >> 0x20);
          damage((CHAR_DATA *)
                 CONCAT26(in_stack_ffffffffffff9386,
                          CONCAT24(in_stack_ffffffffffff9384,
                                   CONCAT22(in_stack_ffffffffffff9382,in_stack_ffffffffffff9380))),
                 (CHAR_DATA *)
                 CONCAT26(in_stack_ffffffffffff937e,
                          CONCAT24(in_stack_ffffffffffff937c,
                                   CONCAT22(in_stack_ffffffffffff937a,in_stack_ffffffffffff9378))),
                 in_stack_ffffffffffff9374,in_stack_ffffffffffff9370,
                 (int)((ulong)in_stack_ffffffffffff9368 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffff9368 >> 0x18,0));
          check_improve(in_stack_ffffffffffff9430,in_stack_ffffffffffff942c,
                        (bool)in_stack_ffffffffffff942b,in_stack_ffffffffffff9424);
        }
        else {
          act((char *)in_stack_ffffffffffff9360,ch_01,in_stack_ffffffffffff9350,
              (void *)CONCAT44(in_stack_ffffffffffff934c,in_stack_ffffffffffff9348),0);
          act((char *)in_stack_ffffffffffff9360,ch_01,in_stack_ffffffffffff9350,
              (void *)CONCAT44(in_stack_ffffffffffff934c,in_stack_ffffffffffff9348),0);
          act((char *)in_stack_ffffffffffff9360,ch_01,in_stack_ffffffffffff9350,
              (void *)CONCAT44(in_stack_ffffffffffff934c,in_stack_ffffffffffff9348),0);
          iVar2 = (int)((ulong)ch_01 >> 0x20);
          bVar1 = is_affected(ch_00,(int)gsn_bleeding);
          if (!bVar1) {
            init_affect((AFFECT_DATA *)0x71b61d);
            new_affect_to_char((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffff9374,in_stack_ffffffffffff9370),
                               (AFFECT_DATA *)local_8);
          }
          one_hit_new(in_stack_ffffffffffff9470,in_stack_ffffffffffff9468,in_stack_ffffffffffff9464,
                      (bool)in_stack_ffffffffffff9463,(bool)in_stack_ffffffffffff9462,
                      in_stack_ffffffffffff945c,in_stack_ffffffffffff9490,in_stack_ffffffffffff9498)
          ;
          check_improve(in_stack_ffffffffffff9430,in_stack_ffffffffffff942c,
                        (bool)in_stack_ffffffffffff942b,in_stack_ffffffffffff9424);
        }
        WAIT_STATE(in_stack_ffffffffffff9360,iVar2);
      }
    }
  }
  return;
}

Assistant:

void do_bleed(CHAR_DATA *ch, char *argument)
{
	char hit1[MSL], hit2[MSL], hit3[MSL], miss1[MSL], miss2[MSL], miss3[MSL];
	int skill, dammod, affect;
	CHAR_DATA *victim;
	OBJ_DATA *weapon;
	AFFECT_DATA af;

	skill = get_skill(ch, gsn_bleed);

	if (skill == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	victim = ch->fighting;

	if (victim == nullptr)
	{
		send_to_char("You must be in combat to do that!\n\r", ch);
		return;
	}

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon != nullptr)
	{
		switch (weapon->value[0])
		{
			case WEAPON_DAGGER:
				sprintf(hit1, "Blood fountains from $N's artery as you make a jagged cut with your dagger!");
				sprintf(hit2, "Blood fountains from your artery as $n makes a jagged cut with $s dagger!");
				sprintf(hit3, "Blood fountains from $N's artery as $n makes a jagged cut with $s dagger!");
				sprintf(miss1, "You lunge forward, attempting to strike $N's artery, but are repulsed.");
				sprintf(miss2, "$n lunges forward, attempting to strike your artery, but is repulsed.");
				sprintf(miss3, "$n lunges forward, attempting to strike $N's artery, but is repulsed.");

				dammod = 125;
				affect = ch->level / 3;
				break;
			case WEAPON_SWORD:
				sprintf(hit1, "Rivulets of blood run to the ground as your blade finds $N's artery!");
				sprintf(hit2, "Rivulets of blood run to the ground as $n's blade finds your artery!");
				sprintf(hit3, "Rivulets of blood run to the ground as $n's blade finds $N's artery!");
				sprintf(miss1, "You slash at $N's exposed artery but fail to connect.");
				sprintf(miss2, "$n slashes at your exposed artery but fails to connect.");
				sprintf(miss3, "$n slashes at $N's exposed artery but fails to connect.");

				dammod = 100;
				affect = ch->level / 4;
				break;
			case WEAPON_AXE:
				sprintf(hit1, "You slightly twist your axe as it sinks into $N's flesh, and a torrent of blood gushes forth!");
				sprintf(hit2, "$n slightly twists $s axe as it sinks into your flesh, and a torrent of blood gushes forth!");
				sprintf(hit3, "$n slightly twists $s axe as it sinks into $N's flesh, and a torrent of blood gushes forth!");
				sprintf(miss1, "You swing your axe in a wide arc but fail to connect with $N.");
				sprintf(miss2, "$n swings $s axe in a wide arc but fails to connect with you.");
				sprintf(miss3, "$n swings $s axe in a wide arc but fails to connect with $N.");

				dammod = 125;
				affect = ch->level / 4;
				break;
			case WEAPON_SPEAR:
				sprintf(hit1, "You drive your spear deep into $N's flesh, blood spilling forth as you withdraw it!");
				sprintf(hit2, "$n drives $s spear deep into your flesh, blood spilling forth as $e withdraws it!");
				sprintf(hit3, "$n drives $s spear deep into $N's flesh, blood spilling forth as $e withdraws it!");
				sprintf(miss1, "You lunge powerfully forward with your spear, but fail to connect.");
				sprintf(miss2, "$n lunges powerfully forward towards you with $s spear, but fails to connect.");
				sprintf(miss3, "$n lunges powerfully forward towards $N with $s spear, but fails to connect.");

				dammod = 200;
				affect = ch->level / 7;
				break;
			default:
				send_to_char("You cannot perform this attack with your weapon!\n\r", ch);
				return;
		}
	}
	else
	{
		send_to_char("You cannot execute that move barehanded!\n\r", ch);
		return;
	}

	if (number_percent() < .65 * skill)
	{

		act(hit1, ch, 0, victim, TO_CHAR);
		act(hit2, ch, 0, victim, TO_VICT);
		act(hit3, ch, 0, victim, TO_NOTVICT);

		if (!is_affected(victim, gsn_bleeding))
		{
			init_affect(&af);
			af.where = TO_AFFECTS;
			af.duration = affect;
			af.type = gsn_bleeding;
			af.level = ch->level;
			af.location = APPLY_NONE;
			af.modifier = 0;
			af.aftype = AFT_MALADY;
			af.end_fun = nullptr;
			af.tick_fun = bleeding_tick;
			af.owner = ch;
			new_affect_to_char(victim, &af);
		}

		one_hit_new(ch, victim, gsn_bleed, HIT_SPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, dammod, nullptr);
		check_improve(ch, gsn_bleed, true, 1);
	}
	else
	{
		act(miss1, ch, 0, victim, TO_CHAR);
		act(miss2, ch, 0, victim, TO_VICT);
		act(miss3, ch, 0, victim, TO_NOTVICT);

		damage(ch, victim, 0, gsn_bleed, DAM_NONE, true);
		check_improve(ch, gsn_bleed, false, 1);
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}